

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLog.cpp
# Opt level: O1

void __thiscall SocketLog::flush(SocketLog *this)

{
  int iVar1;
  size_t in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  _Elt_pointer pbVar2;
  int in_R8D;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->msgQueueMutex);
  if (iVar1 == 0) {
    pbVar2 = (this->msgQueue).c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((this->msgQueue).c.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur != pbVar2) {
      __buf = extraout_RDX;
      do {
        send(this,(int)pbVar2,__buf,in_RCX,in_R8D);
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_front(&(this->msgQueue).c);
        pbVar2 = (this->msgQueue).c.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        __buf = extraout_RDX_00;
      } while ((this->msgQueue).c.
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur != pbVar2);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->msgQueueMutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void SocketLog::flush() {
    std::lock_guard<std::mutex> lock(msgQueueMutex);

    while (!msgQueue.empty()) {
        send(msgQueue.front());
        msgQueue.pop();
    }
}